

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

void __thiscall Unary::Unary(Unary *this,shared_ptr<Token> *t,shared_ptr<Expr> *x)

{
  undefined1 auStack_88 [16];
  shared_ptr<Type> local_78;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> local_48;
  string local_38;
  
  std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&t->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>);
  local_78.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_78.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Op::Op(&this->super_Op,(shared_ptr<Token> *)&local_48,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR_toJson_abi_cxx11__0012b020;
  std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->expr).super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>,
             &x->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             &(((x->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type).
              super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
  Type::max((Type *)auStack_88,(shared_ptr<Type> *)&local_58,(shared_ptr<Type> *)&local_68);
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_Op).super_Expr.type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> *)auStack_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_88 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  if ((this->super_Op).super_Expr.type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"type error",(allocator<char> *)auStack_88);
    Node::error((Node *)this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

Unary(std::shared_ptr<Token> t, std::shared_ptr<Expr> x) : Op(t, nullptr), expr(x) {
		type = Type::max(Type::Int, x->type);
		if (type == nullptr) error("type error");
	}